

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

void burstsort2_sampling_superalphabet_bagwell(uchar **strings,size_t n)

{
  uchar *ptr;
  bool bVar1;
  uint16_t uVar2;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *root;
  undefined8 *puVar3;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this;
  ulong uVar4;
  pointer in_RCX;
  size_t depth;
  long lVar5;
  
  root = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)operator_new(0x18);
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (root->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 2000;
  for (uVar4 = 0; uVar4 < n; uVar4 = uVar4 + 0x2000) {
    ptr = strings[uVar4];
    depth = 0;
    this = root;
    while( true ) {
      uVar2 = get_char<unsigned_short>(ptr,depth);
      if ((char)uVar2 == '\0') break;
      TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::extend(this,uVar2 + 1);
      bVar1 = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::is_trie
                        (this,(uint)uVar2);
      if (!bVar1) {
        puVar3 = (undefined8 *)operator_new(0x18);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = 0;
        in_RCX = (this->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 **)((long)in_RCX + (ulong)((uint)uVar2 * 8)) = puVar3;
        make_trie((void **)((ulong)((uint)uVar2 * 8) +
                           (long)(this->_buckets).
                                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                 super__Vector_impl_data._M_start));
        lVar5 = lVar5 + -1;
        if (lVar5 == 0) goto LAB_001ab069;
      }
      this = TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_node
                       (this,(uint)uVar2);
      depth = depth + 2;
      if (this == (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xd9,
                      "TrieNode<CharT, BucketT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned short, BucketT = vector_bagwell<unsigned char *>]"
                     );
      }
    }
  }
LAB_001ab069:
  insert<32768u,vector_bagwell<unsigned_char*,16u>,BurstSimple<unsigned_short>,unsigned_short>
            (root,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_bagwell<unsigned_char*,16u>,unsigned_short>
            (root,strings,0,(_func_void_uchar_ptr_ptr_int_int *)in_RCX);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_bagwell(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_bagwell<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}